

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publishInt(Publication *this,int64_t val)

{
  bool bVar1;
  long in_RDI;
  SmallBuffer db;
  bool doPublish;
  int64_t in_stack_000000f0;
  DataType in_stack_000000fc;
  double in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  SmallBuffer *this_00;
  defV *in_stack_ffffffffffffff48;
  SmallBuffer *in_stack_ffffffffffffff58;
  data_view *in_stack_ffffffffffffff60;
  Publication *in_stack_ffffffffffffff68;
  ValueFederate *in_stack_ffffffffffffff70;
  undefined1 local_11;
  
  local_11 = *(long *)(in_RDI + 0x38) != 0;
  if ((*(byte *)(in_RDI + 0x5c) & 1) != 0) {
    bVar1 = changeDetected(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff38);
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff60,(long *)in_stack_ffffffffffffff58);
    }
    local_11 = bVar1 && local_11;
  }
  if (local_11) {
    typeConvert(in_stack_000000fc,in_stack_000000f0);
    this_00 = *(SmallBuffer **)(in_RDI + 0x38);
    data_view::data_view(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    helics::ValueFederate::publishBytes
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    data_view::~data_view((data_view *)0x3ac4ef);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publishInt(int64_t val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}